

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::VertexCubeTextureCase::iterate(VertexCubeTextureCase *this)

{
  int w_;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  int y;
  int iVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  int x_;
  int y_;
  RenderTarget *pRVar10;
  char *pcVar11;
  long lVar12;
  RenderContext *pRVar13;
  TestLog *log;
  deUint32 local_2d0;
  float local_2a4;
  float local_2a0;
  int local_29c;
  undefined1 local_268 [7];
  bool isOk;
  undefined1 local_240 [8];
  Surface resImage;
  TexSizeIVec local_210;
  undefined1 local_208 [16];
  Grid grid;
  bool useSafeTexCoords;
  Vec2 local_1a4;
  float local_19c;
  Rect *pRStack_198;
  float lod;
  Render *rend;
  int renderNdx;
  Rect local_178;
  Rect local_168;
  Rect local_158;
  undefined1 local_148 [8];
  Render renders [4];
  int topCellHeight;
  int bottomCellHeight;
  int rightCellWidth;
  int leftCellWidth;
  bool isTopCell;
  bool isRightmostCell;
  int cellOffsetY;
  int cellOffsetX;
  int i;
  int defCellHeight;
  int defCellWidth;
  Surface refImage;
  Vec2 texMagOffset;
  Vec2 texMagScale;
  Vec2 texMinOffset;
  Vec2 texMinScale;
  int topHeight;
  int bottomHeight;
  int rightWidth;
  int leftWidth;
  int viewportYOffset;
  undefined1 local_30 [4];
  int viewportXOffset;
  Random rnd;
  int viewportYOffsetMax;
  int viewportXOffsetMax;
  int viewportHeight;
  int viewportWidth;
  VertexCubeTextureCase *this_local;
  
  pRVar10 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar10);
  iVar2 = ::deMin32(iVar2,0xa8);
  pRVar10 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getHeight(pRVar10);
  iVar3 = ::deMin32(iVar3,0x70);
  pRVar10 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getWidth(pRVar10);
  rnd.m_rnd.w = iVar4 - iVar2;
  pRVar10 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getHeight(pRVar10);
  rnd.m_rnd.z = iVar4 - iVar3;
  pcVar11 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar11);
  de::Random::Random((Random *)local_30,dVar5);
  iVar4 = de::Random::getInt((Random *)local_30,0,rnd.m_rnd.w);
  y = de::Random::getInt((Random *)local_30,0,rnd.m_rnd.z);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  glwUseProgram(dVar5);
  iVar6 = iVar2 / 2;
  iVar7 = iVar3 / 2;
  glwClearColor(0.125,0.25,0.5,1.0);
  glwClear(0x4000);
  tcu::Vector<float,_2>::Vector(&texMinOffset,1.0,1.0);
  tcu::Vector<float,_2>::Vector(&texMagScale,0.0,0.0);
  tcu::Vector<float,_2>::Vector(&texMagOffset,0.3,0.3);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&refImage.m_pixels.m_cap,0.5,0.3);
  tcu::Surface::Surface((Surface *)&defCellHeight,iVar2,iVar3);
  iVar8 = (int)((long)((ulong)(uint)((int)((long)iVar2 / 2) >> 0x1f) << 0x20 |
                      (long)iVar2 / 2 & 0xffffffffU) / 3);
  fVar9 = (float)((long)((ulong)(uint)((int)((long)iVar3 / 2) >> 0x1f) << 0x20 |
                        (long)iVar3 / 2 & 0xffffffffU) / 2);
  for (cellOffsetY = 0; cellOffsetY < 6; cellOffsetY = cellOffsetY + 1) {
    x_ = iVar8 * (cellOffsetY % 3);
    y_ = (int)fVar9 * (cellOffsetY / 3);
    local_29c = iVar8;
    w_ = iVar8;
    if (cellOffsetY == 2 || cellOffsetY == 5) {
      local_29c = (iVar2 - iVar6) - x_;
      w_ = iVar6 - x_;
    }
    local_2a0 = fVar9;
    if (2 < cellOffsetY) {
      local_2a0 = (float)(iVar7 - y_);
    }
    renders[3].texCoordOffset.m_data[1] = local_2a0;
    local_2a4 = fVar9;
    if (2 < cellOffsetY) {
      local_2a4 = (float)((iVar3 - iVar7) - y_);
    }
    renders[3].texCoordOffset.m_data[0] = local_2a4;
    anon_unknown_1::Rect::Rect(&local_158,x_,y_,w_,(int)local_2a0);
    iterate()::Render::Render(deqp::gles3::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
    Vector<float,2>const&,tcu::Vector<float,2>_const__
              (local_148,&local_158,0,&texMinOffset,&texMagScale);
    anon_unknown_1::Rect::Rect
              (&local_168,x_ + iVar6,y_,local_29c,(int)renders[3].texCoordOffset.m_data[1]);
    iterate()::Render::Render(deqp::gles3::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
    Vector<float,2>const&,tcu::Vector<float,2>_const__
              (&renders[0].texCoordOffset,&local_168,0,&texMagOffset,
               (Vec2 *)&refImage.m_pixels.m_cap);
    anon_unknown_1::Rect::Rect(&local_178,x_,y_ + iVar7,w_,(int)renders[3].texCoordOffset.m_data[0])
    ;
    iterate()::Render::Render(deqp::gles3::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
    Vector<float,2>const&,tcu::Vector<float,2>_const__
              (&renders[1].texCoordOffset,&local_178,1,&texMinOffset,&texMagScale);
    anon_unknown_1::Rect::Rect
              ((Rect *)&stack0xfffffffffffffe78,x_ + iVar6,y_ + iVar7,local_29c,
               (int)renders[3].texCoordOffset.m_data[0]);
    iterate()::Render::Render(deqp::gles3::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
    Vector<float,2>const&,tcu::Vector<float,2>_const__
              (&renders[2].texCoordOffset,(Rect *)&stack0xfffffffffffffe78,1,&texMagOffset,
               (Vec2 *)&refImage.m_pixels.m_cap);
    for (rend._4_4_ = 0; rend._4_4_ < 4; rend._4_4_ = rend._4_4_ + 1) {
      lVar12 = (long)rend._4_4_;
      pRStack_198 = (Rect *)&renders[lVar12 + -1].texCoordOffset;
      anon_unknown_1::Rect::size
                ((Rect *)((long)&grid.m_indices.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      tcu::Vector<int,_2>::asFloat((Vector<int,_2> *)&local_1a4);
      local_19c = calculateLod(this,(Vec2 *)&renders[lVar12].region.h,&local_1a4,pRStack_198[1].x);
      if (local_19c <= 0.0) {
        local_2d0 = this->m_magFilter;
      }
      else {
        local_2d0 = this->m_minFilter;
      }
      grid.m_indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = isLevelNearest(local_2d0);
      anon_unknown_1::Rect::size((Rect *)local_208);
      getTextureSize((Functional *)&local_210,this->m_textures[pRStack_198[1].x]);
      anon_unknown_1::TexTypeCoordParams<(glu::TextureTestUtil::TextureType)1>::TexTypeCoordParams
                ((TexTypeCoordParams<(glu::TextureTestUtil::TextureType)1> *)
                 ((long)&resImage.m_pixels.m_cap + 4),(Vec2 *)&pRStack_198[1].y,
                 (Vec2 *)&pRStack_198[1].h,cellOffsetY);
      anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1>::PosTexCoordQuadGrid
                ((PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1> *)(local_208 + 8),0x3f,
                 (IVec2 *)local_208,&local_210,
                 (TexCoordParams *)((long)&resImage.m_pixels.m_cap + 4),
                 (bool)(grid.m_indices.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._3_1_ & 1));
      glwViewport(iVar4 + pRStack_198->x,y + pRStack_198->y,pRStack_198->w,pRStack_198->h);
      renderCell(this,pRStack_198[1].x,local_19c,(Grid *)(local_208 + 8));
      computeReferenceCell
                (this,pRStack_198[1].x,local_19c,(Grid *)(local_208 + 8),(Surface *)&defCellHeight,
                 pRStack_198);
      anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1>::
      ~PosTexCoordQuadGrid
                ((PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1> *)(local_208 + 8));
    }
  }
  tcu::Surface::Surface((Surface *)local_240,iVar2,iVar3);
  pRVar13 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)local_268,(Surface *)local_240);
  glu::readPixels(pRVar13,iVar4,y,(PixelBufferAccess *)local_268);
  glwUseProgram(0);
  pRVar13 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = compareImages(pRVar13,log,(Surface *)&defCellHeight,(Surface *)local_240);
  pcVar11 = "Image comparison failed";
  if (bVar1) {
    pcVar11 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar1 & QP_TEST_RESULT_FAIL,pcVar11);
  tcu::Surface::~Surface((Surface *)local_240);
  tcu::Surface::~Surface((Surface *)&defCellHeight);
  de::Random::~Random((Random *)local_30);
  return STOP;
}

Assistant:

VertexCubeTextureCase::IterateResult VertexCubeTextureCase::iterate (void)
{
	const int	viewportWidth		= deMin32(m_context.getRenderTarget().getWidth(), MAX_CUBE_RENDER_WIDTH);
	const int	viewportHeight		= deMin32(m_context.getRenderTarget().getHeight(), MAX_CUBE_RENDER_HEIGHT);

	const int	viewportXOffsetMax	= m_context.getRenderTarget().getWidth() - viewportWidth;
	const int	viewportYOffsetMax	= m_context.getRenderTarget().getHeight() - viewportHeight;

	de::Random	rnd					(deStringHash(getName()));

	const int	viewportXOffset		= rnd.getInt(0, viewportXOffsetMax);
	const int	viewportYOffset		= rnd.getInt(0, viewportYOffsetMax);

	glUseProgram(m_program->getProgram());

	// Divide viewport into 4 areas.
	const int leftWidth		= viewportWidth / 2;
	const int rightWidth	= viewportWidth - leftWidth;
	const int bottomHeight	= viewportHeight / 2;
	const int topHeight		= viewportHeight - bottomHeight;

	// Clear.
	glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	// Texture scaling and offsetting vectors.
	const Vec2 texMinScale		(1.0f, 1.0f);
	const Vec2 texMinOffset		(0.0f, 0.0f);
	const Vec2 texMagScale		(0.3f, 0.3f);
	const Vec2 texMagOffset		(0.5f, 0.3f);

	// Surface for the reference image.
	tcu::Surface refImage(viewportWidth, viewportHeight);

	// Each of the four areas is divided into 6 cells.
	const int defCellWidth	= viewportWidth / 2 / 3;
	const int defCellHeight	= viewportHeight / 2 / 2;

	for (int i = 0; i < tcu::CUBEFACE_LAST; i++)
	{
		const int	cellOffsetX			= defCellWidth * (i % 3);
		const int	cellOffsetY			= defCellHeight * (i / 3);
		const bool	isRightmostCell		= i == 2 || i == 5;
		const bool	isTopCell			= i >= 3;
		const int	leftCellWidth		= isRightmostCell	? leftWidth		- cellOffsetX : defCellWidth;
		const int	rightCellWidth		= isRightmostCell	? rightWidth	- cellOffsetX : defCellWidth;
		const int	bottomCellHeight	= isTopCell			? bottomHeight	- cellOffsetY : defCellHeight;
		const int	topCellHeight		= isTopCell			? topHeight		- cellOffsetY : defCellHeight;

		const struct Render
		{
			const Rect	region;
			int			textureNdx;
			const Vec2	texCoordScale;
			const Vec2	texCoordOffset;
			Render (const Rect& r, int tN, const Vec2& tS, const Vec2& tO) : region(r), textureNdx(tN), texCoordScale(tS), texCoordOffset(tO) {}
		} renders[] =
		{
			Render(Rect(cellOffsetX + 0,			cellOffsetY + 0,				leftCellWidth,	bottomCellHeight),	0, texMinScale, texMinOffset),
			Render(Rect(cellOffsetX + leftWidth,	cellOffsetY + 0,				rightCellWidth,	bottomCellHeight),	0, texMagScale, texMagOffset),
			Render(Rect(cellOffsetX + 0,			cellOffsetY + bottomHeight,		leftCellWidth,	topCellHeight),		1, texMinScale, texMinOffset),
			Render(Rect(cellOffsetX + leftWidth,	cellOffsetY + bottomHeight,		rightCellWidth,	topCellHeight),		1, texMagScale, texMagOffset)
		};

		for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renders); renderNdx++)
		{
			const Render&	rend				= renders[renderNdx];
			const float		lod					= calculateLod(rend.texCoordScale, rend.region.size().asFloat(), rend.textureNdx);
			const bool		useSafeTexCoords	= isLevelNearest(lod > 0.0f ? m_minFilter : m_magFilter);
			const Grid		grid				(GRID_SIZE_CUBE, rend.region.size(), getTextureSize(*m_textures[rend.textureNdx]),
												 TexTypeCoordParams<TEXTURETYPE_CUBE>(rend.texCoordScale, rend.texCoordOffset, (tcu::CubeFace)i), useSafeTexCoords);

			glViewport(viewportXOffset + rend.region.x, viewportYOffset + rend.region.y, rend.region.w, rend.region.h);
			renderCell				(rend.textureNdx, lod, grid);
			computeReferenceCell	(rend.textureNdx, lod, grid, refImage, rend.region);
		}
	}

	// Read back rendered results.
	tcu::Surface resImage(viewportWidth, viewportHeight);
	glu::readPixels(m_context.getRenderContext(), viewportXOffset, viewportYOffset, resImage.getAccess());

	glUseProgram(0);

	// Compare and log.
	{
		const bool isOk = compareImages(m_context.getRenderContext(), m_testCtx.getLog(), refImage, resImage);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}